

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeAddrModeImm12Operand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  ulong Val_00;
  
  uVar2 = Val >> 0xc & 1;
  MCOperand_CreateReg0(Inst,(uint)*(ushort *)((long)GPRDecoderTable + (ulong)(Val >> 0xc & 0x1e)));
  uVar1 = -(Val & 0xfff);
  if (uVar2 != 0) {
    uVar1 = Val & 0xfff;
  }
  Val_00 = 0x80000000;
  if (uVar2 != 0 || uVar1 != 0) {
    Val_00 = (ulong)uVar1;
  }
  MCOperand_CreateImm0(Inst,Val_00);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeAddrModeImm12Operand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned add = fieldFromInstruction_4(Val, 12, 1);
	unsigned imm = fieldFromInstruction_4(Val, 0, 12);
	unsigned Rn = fieldFromInstruction_4(Val, 13, 4);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	if (!add) imm *= (unsigned int)-1;
	if (imm == 0 && !add) imm = (unsigned int)INT32_MIN;
	MCOperand_CreateImm0(Inst, imm);
	//if (Rn == 15)
	//  tryAddingPcLoadReferenceComment(Address, Address + imm + 8, Decoder);

	return S;
}